

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterovector.hpp
# Opt level: O0

int __thiscall heterovector::count(heterovector *this,variant<int,_float,_double> val)

{
  bool bVar1;
  iterator __lhs;
  iterator __rhs;
  reference pvVar2;
  variant<int,_float,_double> i;
  iterator __end1;
  iterator __begin1;
  vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  *__range1;
  int counter;
  vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
  *in_stack_ffffffffffffffc0;
  int local_1c;
  
  local_1c = 0;
  __lhs = std::
          vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
          ::begin(in_stack_ffffffffffffffb8);
  __rhs = std::
          vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
          ::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffc0,
                            (__normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    pvVar2 = __gnu_cxx::
             __normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
             ::operator*((__normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
                          *)&stack0xffffffffffffffd0);
    in_stack_ffffffffffffffb8 =
         *(vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
           **)&(pvVar2->super__Variant_base<int,_float,_double>).
               super__Move_assign_alias<int,_float,_double>.
               super__Copy_assign_alias<int,_float,_double>.
               super__Move_ctor_alias<int,_float,_double>.super__Copy_ctor_alias<int,_float,_double>
               .super__Variant_storage_alias<int,_float,_double>._M_u;
    in_stack_ffffffffffffffc0 =
         *(__normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
           **)&(pvVar2->super__Variant_base<int,_float,_double>).
               super__Move_assign_alias<int,_float,_double>.
               super__Copy_assign_alias<int,_float,_double>.
               super__Move_ctor_alias<int,_float,_double>.super__Copy_ctor_alias<int,_float,_double>
               .super__Variant_storage_alias<int,_float,_double>._M_index;
    bVar1 = std::operator==(__lhs._M_current,__rhs._M_current);
    if (bVar1) {
      local_1c = local_1c + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
    ::operator++((__normal_iterator<std::variant<int,_float,_double>_*,_std::vector<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  return local_1c;
}

Assistant:

int heterovector::count(std::variant<int, float, double> val) {
    int counter = 0;
    for (auto i : vec)
        if (i == val)
            counter++;

    return counter;
}